

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_exp>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [24];
  long *in_RDI;
  float fVar38;
  float fVar39;
  undefined1 auVar37 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_exp op;
  Mat *m;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  int local_101c;
  undefined8 local_1018;
  undefined8 local_1010;
  undefined8 local_1008;
  undefined4 local_1000;
  long local_ff8;
  undefined4 local_ff0;
  undefined4 local_fec;
  undefined4 local_fe8;
  undefined4 local_fe4;
  undefined4 local_fe0;
  undefined8 local_fd8;
  undefined1 (*local_fd0) [32];
  int local_fc8;
  int local_fc4;
  int local_fc0;
  int local_fbc;
  int local_fb8;
  int local_fb4;
  int local_fb0;
  undefined1 local_fa9 [9];
  long *local_fa0;
  undefined1 local_f95;
  int local_f94;
  undefined8 *local_f88;
  undefined8 *local_f80;
  undefined8 *local_f70;
  undefined1 (*local_f68) [32];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined1 (*local_f30) [32];
  undefined1 (*local_f28) [32];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined1 (*local_f10) [32];
  long local_f08;
  undefined4 local_efc;
  long local_ef8;
  undefined1 (*local_ef0) [32];
  undefined4 local_ee4;
  int local_ee0;
  int local_edc;
  undefined8 *local_ed8;
  undefined4 local_ecc;
  long local_ec8;
  undefined8 *local_eb8;
  undefined8 *local_e90;
  undefined1 *local_e88;
  undefined8 *local_e80;
  undefined1 *local_e78;
  undefined1 (*local_e70) [32];
  undefined1 *local_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 local_e40 [8];
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined1 local_e20 [32];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [32];
  undefined1 local_da0 [8];
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined1 local_d80 [32];
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [32];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 *local_b98;
  undefined1 *local_b90;
  undefined1 *local_b88;
  float *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  float *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  float *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  float *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  float *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  float *local_b08;
  float *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  float *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  float *local_ad0;
  undefined1 *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined4 local_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0 [2];
  float afStack_898 [2];
  float afStack_890 [2];
  float afStack_888 [2];
  float local_880 [2];
  float afStack_878 [2];
  float afStack_870 [2];
  float afStack_868 [2];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float local_840 [2];
  float afStack_838 [2];
  float afStack_830 [2];
  float afStack_828 [2];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0 [2];
  float afStack_7d8 [2];
  float afStack_7d0 [2];
  float afStack_7c8 [2];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float local_780 [2];
  float afStack_778 [2];
  float afStack_770 [2];
  float afStack_768 [2];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720 [2];
  float afStack_718 [2];
  float afStack_710 [2];
  float afStack_708 [2];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0 [2];
  float afStack_6b8 [2];
  float afStack_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0 [2];
  float afStack_5d8 [2];
  float afStack_5d0 [2];
  float afStack_5c8 [2];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  float local_580 [2];
  float afStack_578 [2];
  float afStack_570 [2];
  float afStack_568 [2];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined4 local_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined4 local_4d4;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined1 local_4b0 [8];
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  undefined1 local_470 [8];
  undefined8 uStack_468;
  undefined1 local_460 [8];
  undefined8 uStack_458;
  undefined1 local_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined4 local_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 *local_270;
  float *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  float *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  float *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  float *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  float *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  float *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  float *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  float local_f0 [2];
  float afStack_e8 [2];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90 [2];
  float afStack_88 [2];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_fb0 = *(int *)((long)in_RDI + 0x2c);
  local_fb4 = (int)in_RDI[6];
  local_fb8 = *(int *)((long)in_RDI + 0x34);
  local_fbc = (int)in_RDI[7];
  local_fc0 = (int)in_RDI[3];
  local_fc4 = local_fb0 * local_fb4 * local_fb8 * local_fc0;
  local_fa0 = in_RDI;
  for (local_fc8 = 0; local_fc8 < local_fbc; local_fc8 = local_fc8 + 1) {
    local_f88 = &local_1018;
    local_edc = *(int *)((long)local_fa0 + 0x2c);
    local_ee0 = (int)local_fa0[6];
    local_ee4 = *(undefined4 *)((long)local_fa0 + 0x34);
    local_ef0 = (undefined1 (*) [32])(*local_fa0 + local_fa0[8] * (long)local_fc8 * local_fa0[2]);
    local_ef8 = local_fa0[2];
    local_efc = (undefined4)local_fa0[3];
    local_f08 = local_fa0[4];
    local_ed8 = &local_1018;
    local_ec8 = (long)local_edc * (long)local_ee0 * local_ef8;
    local_f80 = &local_1018;
    local_f70 = &local_1018;
    local_ecc = 0x10;
    local_f94 = local_fc8;
    local_f95 = 1;
    local_1018 = 0;
    local_1008 = 0;
    local_1000 = 0;
    local_ff0 = 0;
    local_fec = 0;
    local_fe8 = 0;
    local_fe4 = 0;
    local_fe0 = 0;
    local_fd8 = 0;
    local_1010 = 0;
    local_fd0 = local_ef0;
    for (local_101c = 0; local_101c + 7 < local_fc4; local_101c = local_101c + 8) {
      local_f68 = local_fd0;
      uStack_bf0 = *(undefined8 *)(*local_fd0 + 0x10);
      uStack_be8 = *(undefined8 *)(*local_fd0 + 0x18);
      local_e88 = local_fa9;
      local_e90 = &local_1040;
      local_cc0 = ZEXT832(0) << 0x20;
      local_e00 = 0x3f8000003f800000;
      uStack_df8 = 0x3f8000003f800000;
      uStack_df0 = 0x3f8000003f800000;
      uStack_de8 = 0x3f8000003f800000;
      local_d80._0_8_ = SUB168(*(undefined1 (*) [16])*local_fd0,0);
      local_c00 = local_d80._0_8_;
      local_d80._8_8_ = SUB168(*(undefined1 (*) [16])*local_fd0,8);
      uStack_bf8 = local_d80._8_8_;
      local_c20 = 0x42b0c0a542b0c0a5;
      uStack_c18 = 0x42b0c0a542b0c0a5;
      uStack_c10 = 0x42b0c0a542b0c0a5;
      uStack_c08 = 0x42b0c0a542b0c0a5;
      auVar3._8_8_ = 0x42b0c0a542b0c0a5;
      auVar3._0_8_ = 0x42b0c0a542b0c0a5;
      auVar3._16_8_ = 0x42b0c0a542b0c0a5;
      auVar3._24_8_ = 0x42b0c0a542b0c0a5;
      auVar4 = vminps_avx(*local_fd0,auVar3);
      local_d80._0_8_ = auVar4._0_8_;
      local_bc0 = local_d80._0_8_;
      local_d80._8_8_ = auVar4._8_8_;
      uStack_bb8 = local_d80._8_8_;
      local_d80._16_8_ = auVar4._16_8_;
      uStack_bb0 = local_d80._16_8_;
      local_d80._24_8_ = auVar4._24_8_;
      uStack_ba8 = local_d80._24_8_;
      local_be0 = 0xc2b0c0a5c2b0c0a5;
      uStack_bd8 = 0xc2b0c0a5c2b0c0a5;
      uStack_bd0 = 0xc2b0c0a5c2b0c0a5;
      uStack_bc8 = 0xc2b0c0a5c2b0c0a5;
      auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar4,auVar5);
      local_b98 = local_d80;
      local_b00 = ::_ps256_cephes_LOG2EF;
      local_b08 = ::_ps256_0p5;
      local_d80._0_8_ = auVar3._0_8_;
      local_860 = local_d80._0_8_;
      local_d80._8_8_ = auVar3._8_8_;
      uStack_858 = local_d80._8_8_;
      local_d80._16_8_ = auVar3._16_8_;
      uStack_850 = local_d80._16_8_;
      local_d80._24_8_ = auVar3._24_8_;
      uStack_848 = local_d80._24_8_;
      local_880[0] = 1.442695;
      local_880[1] = 1.442695;
      afStack_878[0] = 1.442695;
      afStack_878[1] = 1.442695;
      afStack_870[0] = 1.442695;
      afStack_870[1] = 1.442695;
      afStack_868[0] = 1.442695;
      afStack_868[1] = 1.442695;
      local_8a0[0] = 0.5;
      local_8a0[1] = 0.5;
      afStack_898[0] = 0.5;
      afStack_898[1] = 0.5;
      afStack_890[0] = 0.5;
      afStack_890[1] = 0.5;
      afStack_888[0] = 0.5;
      afStack_888[1] = 0.5;
      auVar13._8_4_ = 1.442695;
      auVar13._12_4_ = 1.442695;
      auVar13._0_4_ = 1.442695;
      auVar13._4_4_ = 1.442695;
      auVar13._16_4_ = 1.442695;
      auVar13._20_4_ = 1.442695;
      auVar13._24_4_ = 1.442695;
      auVar13._28_4_ = 1.442695;
      auVar12._8_4_ = 0.5;
      auVar12._12_4_ = 0.5;
      auVar12._0_4_ = 0.5;
      auVar12._4_4_ = 0.5;
      auVar12._16_4_ = 0.5;
      auVar12._20_4_ = 0.5;
      auVar12._24_4_ = 0.5;
      auVar12._28_4_ = 0.5;
      auVar6 = vfmadd213ps_fma(auVar13,auVar3,auVar12);
      auVar5 = vroundps_avx(ZEXT1632(auVar6),1);
      auVar4 = vcmpps_avx(ZEXT1632(auVar6),auVar5,1);
      local_e20._0_8_ = auVar4._0_8_;
      local_d20 = local_e20._0_8_;
      local_e20._8_8_ = auVar4._8_8_;
      uStack_d18 = local_e20._8_8_;
      local_e20._16_8_ = auVar4._16_8_;
      uStack_d10 = local_e20._16_8_;
      local_e20._24_8_ = auVar4._24_8_;
      uStack_d08 = local_e20._24_8_;
      local_d40 = 0x3f8000003f800000;
      uStack_d38 = 0x3f8000003f800000;
      uStack_d30 = 0x3f8000003f800000;
      uStack_d28 = 0x3f8000003f800000;
      auVar37._8_8_ = 0x3f8000003f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      auVar37._16_8_ = 0x3f8000003f800000;
      auVar37._24_8_ = 0x3f8000003f800000;
      local_e20 = vandps_avx(auVar4,auVar37);
      local_da0 = auVar5._0_8_;
      local_ce0 = local_da0;
      uStack_d98 = auVar5._8_8_;
      uStack_cd8 = uStack_d98;
      uStack_d90 = auVar5._16_8_;
      uStack_cd0 = uStack_d90;
      uStack_d88 = auVar5._24_8_;
      uStack_cc8 = uStack_d88;
      local_d00 = local_e20._0_8_;
      uStack_cf8 = local_e20._8_8_;
      uStack_cf0 = local_e20._16_8_;
      uStack_ce8 = local_e20._24_8_;
      local_dc0 = vsubps_avx(auVar5,local_e20);
      local_ae0 = local_dc0;
      local_ad0 = ::_ps256_cephes_exp_C1;
      local_5c0 = local_dc0._0_8_;
      uStack_5b8 = local_dc0._8_8_;
      uStack_5b0 = local_dc0._16_8_;
      uStack_5a8 = local_dc0._24_8_;
      local_5e0[0] = 0.6933594;
      local_5e0[1] = 0.6933594;
      afStack_5d8[0] = 0.6933594;
      afStack_5d8[1] = 0.6933594;
      afStack_5d0[0] = 0.6933594;
      afStack_5d0[1] = 0.6933594;
      afStack_5c8[0] = 0.6933594;
      afStack_5c8[1] = 0.6933594;
      local_600 = local_d80._0_8_;
      uStack_5f8 = local_d80._8_8_;
      uStack_5f0 = local_d80._16_8_;
      uStack_5e8 = local_d80._24_8_;
      auVar19._8_4_ = 0.6933594;
      auVar19._12_4_ = 0.6933594;
      auVar19._0_4_ = 0.6933594;
      auVar19._4_4_ = 0.6933594;
      auVar19._16_4_ = 0.6933594;
      auVar19._20_4_ = 0.6933594;
      auVar19._24_4_ = 0.6933594;
      auVar19._28_4_ = 0.6933594;
      auVar6 = vfnmadd213ps_fma(auVar19,local_dc0,auVar3);
      local_ae8 = ::_ps256_cephes_exp_C2;
      local_560 = local_dc0._0_8_;
      uStack_558 = local_dc0._8_8_;
      uStack_550 = local_dc0._16_8_;
      uStack_548 = local_dc0._24_8_;
      local_580[0] = -0.00021219444;
      local_580[1] = -0.00021219444;
      afStack_578[0] = -0.00021219444;
      afStack_578[1] = -0.00021219444;
      afStack_570[0] = -0.00021219444;
      afStack_570[1] = -0.00021219444;
      afStack_568[0] = -0.00021219444;
      afStack_568[1] = -0.00021219444;
      local_d80._0_8_ = auVar6._0_8_;
      local_5a0 = local_d80._0_8_;
      local_d80._8_8_ = auVar6._8_8_;
      uStack_598 = local_d80._8_8_;
      uStack_590 = 0;
      uStack_588 = 0;
      auVar20._8_4_ = -0.00021219444;
      auVar20._12_4_ = -0.00021219444;
      auVar20._0_4_ = -0.00021219444;
      auVar20._4_4_ = -0.00021219444;
      auVar20._16_4_ = -0.00021219444;
      auVar20._20_4_ = -0.00021219444;
      auVar20._24_4_ = -0.00021219444;
      auVar20._28_4_ = -0.00021219444;
      auVar6 = vfnmadd213ps_fma(auVar20,local_dc0,ZEXT1632(auVar6));
      auVar37 = ZEXT1632(auVar6);
      local_d80._0_8_ = auVar6._0_8_;
      local_c60 = local_d80._0_8_;
      local_d80._8_8_ = auVar6._8_8_;
      uStack_c58 = local_d80._8_8_;
      uStack_c50 = 0;
      uStack_c48 = 0;
      local_c40._0_4_ = auVar6._0_4_;
      local_c40._4_4_ = auVar6._4_4_;
      uStack_c38._0_4_ = auVar6._8_4_;
      uStack_c38._4_4_ = auVar6._12_4_;
      local_da0._4_4_ = local_c40._4_4_ * local_c40._4_4_;
      local_da0._0_4_ = (float)local_c40 * (float)local_c40;
      local_640 = local_da0;
      uStack_d98._0_4_ = (float)uStack_c38 * (float)uStack_c38;
      uStack_d98._4_4_ = uStack_c38._4_4_ * uStack_c38._4_4_;
      auVar1 = _local_da0;
      _local_da0 = ZEXT1632(_local_da0);
      auVar5 = _local_da0;
      uStack_e38 = 0x3950696739506967;
      local_e40 = (undefined1  [8])0x3950696739506967;
      uStack_e30 = 0x3950696739506967;
      uStack_e28 = 0x3950696739506967;
      local_b88 = local_e40;
      local_b20 = ::_ps256_cephes_exp_p1;
      local_800 = 0x3950696739506967;
      uStack_7f8 = 0x3950696739506967;
      uStack_7f0 = 0x3950696739506967;
      uStack_7e8 = 0x3950696739506967;
      local_820 = local_d80._0_8_;
      uStack_818 = local_d80._8_8_;
      uStack_810 = 0;
      uStack_808 = 0;
      local_840[0] = 0.0013981999;
      local_840[1] = 0.0013981999;
      afStack_838[0] = 0.0013981999;
      afStack_838[1] = 0.0013981999;
      afStack_830[0] = 0.0013981999;
      afStack_830[1] = 0.0013981999;
      afStack_828[0] = 0.0013981999;
      afStack_828[1] = 0.0013981999;
      auVar14._8_4_ = 0.0013981999;
      auVar14._12_4_ = 0.0013981999;
      auVar14._0_4_ = 0.0013981999;
      auVar14._4_4_ = 0.0013981999;
      auVar14._16_4_ = 0.0013981999;
      auVar14._20_4_ = 0.0013981999;
      auVar14._24_4_ = 0.0013981999;
      auVar14._28_4_ = 0.0013981999;
      auVar6 = vfmadd213ps_fma(auVar37,_local_e40,auVar14);
      local_b38 = ::_ps256_cephes_exp_p2;
      local_e40 = auVar6._0_8_;
      local_7a0 = local_e40;
      uStack_e38 = auVar6._8_8_;
      uStack_798 = uStack_e38;
      uStack_790 = 0;
      uStack_788 = 0;
      local_7c0 = local_d80._0_8_;
      uStack_7b8 = local_d80._8_8_;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0[0] = 0.008333452;
      local_7e0[1] = 0.008333452;
      afStack_7d8[0] = 0.008333452;
      afStack_7d8[1] = 0.008333452;
      afStack_7d0[0] = 0.008333452;
      afStack_7d0[1] = 0.008333452;
      afStack_7c8[0] = 0.008333452;
      afStack_7c8[1] = 0.008333452;
      auVar15._8_4_ = 0.008333452;
      auVar15._12_4_ = 0.008333452;
      auVar15._0_4_ = 0.008333452;
      auVar15._4_4_ = 0.008333452;
      auVar15._16_4_ = 0.008333452;
      auVar15._20_4_ = 0.008333452;
      auVar15._24_4_ = 0.008333452;
      auVar15._28_4_ = 0.008333452;
      auVar6 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar6),auVar15);
      local_b50 = ::_ps256_cephes_exp_p3;
      local_e40 = auVar6._0_8_;
      local_740 = local_e40;
      uStack_e38 = auVar6._8_8_;
      uStack_738 = uStack_e38;
      uStack_730 = 0;
      uStack_728 = 0;
      local_760 = local_d80._0_8_;
      uStack_758 = local_d80._8_8_;
      uStack_750 = 0;
      uStack_748 = 0;
      local_780[0] = 0.041665796;
      local_780[1] = 0.041665796;
      afStack_778[0] = 0.041665796;
      afStack_778[1] = 0.041665796;
      afStack_770[0] = 0.041665796;
      afStack_770[1] = 0.041665796;
      afStack_768[0] = 0.041665796;
      afStack_768[1] = 0.041665796;
      auVar16._8_4_ = 0.041665796;
      auVar16._12_4_ = 0.041665796;
      auVar16._0_4_ = 0.041665796;
      auVar16._4_4_ = 0.041665796;
      auVar16._16_4_ = 0.041665796;
      auVar16._20_4_ = 0.041665796;
      auVar16._24_4_ = 0.041665796;
      auVar16._28_4_ = 0.041665796;
      auVar6 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar6),auVar16);
      local_b68 = ::_ps256_cephes_exp_p4;
      local_e40 = auVar6._0_8_;
      local_6e0 = local_e40;
      uStack_e38 = auVar6._8_8_;
      uStack_6d8 = uStack_e38;
      uStack_6d0 = 0;
      uStack_6c8 = 0;
      local_700 = local_d80._0_8_;
      uStack_6f8 = local_d80._8_8_;
      uStack_6f0 = 0;
      uStack_6e8 = 0;
      local_720[0] = 0.16666666;
      local_720[1] = 0.16666666;
      afStack_718[0] = 0.16666666;
      afStack_718[1] = 0.16666666;
      afStack_710[0] = 0.16666666;
      afStack_710[1] = 0.16666666;
      afStack_708[0] = 0.16666666;
      afStack_708[1] = 0.16666666;
      auVar17._8_4_ = 0.16666666;
      auVar17._12_4_ = 0.16666666;
      auVar17._0_4_ = 0.16666666;
      auVar17._4_4_ = 0.16666666;
      auVar17._16_4_ = 0.16666666;
      auVar17._20_4_ = 0.16666666;
      auVar17._24_4_ = 0.16666666;
      auVar17._28_4_ = 0.16666666;
      auVar6 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar6),auVar17);
      local_b80 = ::_ps256_cephes_exp_p5;
      local_e40 = auVar6._0_8_;
      local_680 = local_e40;
      uStack_e38 = auVar6._8_8_;
      uStack_678 = uStack_e38;
      uStack_670 = 0;
      uStack_668 = 0;
      local_6a0 = local_d80._0_8_;
      uStack_698 = local_d80._8_8_;
      uStack_690 = 0;
      uStack_688 = 0;
      local_6c0[0] = 0.5;
      local_6c0[1] = 0.5;
      afStack_6b8[0] = 0.5;
      afStack_6b8[1] = 0.5;
      afStack_6b0[0] = 0.5;
      afStack_6b0[1] = 0.5;
      afStack_6a8[0] = 0.5;
      afStack_6a8[1] = 0.5;
      auVar18._8_4_ = 0.5;
      auVar18._12_4_ = 0.5;
      auVar18._0_4_ = 0.5;
      auVar18._4_4_ = 0.5;
      auVar18._16_4_ = 0.5;
      auVar18._20_4_ = 0.5;
      auVar18._24_4_ = 0.5;
      auVar18._28_4_ = 0.5;
      auVar6 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar6),auVar18);
      local_b90 = local_da0;
      local_e40 = auVar6._0_8_;
      local_620 = local_e40;
      uStack_e38 = auVar6._8_8_;
      uStack_618 = uStack_e38;
      uStack_610 = 0;
      uStack_608 = 0;
      uStack_d98 = auVar1._8_8_;
      uStack_638 = uStack_d98;
      uStack_630 = 0;
      uStack_628 = 0;
      local_660 = local_d80._0_8_;
      uStack_658 = local_d80._8_8_;
      uStack_650 = 0;
      uStack_648 = 0;
      auVar6 = vfmadd213ps_fma(auVar5,ZEXT1632(auVar6),auVar37);
      local_e40 = auVar6._0_8_;
      uVar7 = local_e40;
      uStack_e38 = auVar6._8_8_;
      uVar8 = uStack_e38;
      uStack_a90 = 0;
      uStack_a88 = 0;
      local_ac0 = 0x3f8000003f800000;
      uStack_ab8 = 0x3f8000003f800000;
      uStack_ab0 = 0x3f8000003f800000;
      uStack_aa8 = 0x3f8000003f800000;
      local_aa0._0_4_ = auVar6._0_4_;
      local_aa0._4_4_ = auVar6._4_4_;
      uStack_a98._0_4_ = auVar6._8_4_;
      uStack_a98._4_4_ = auVar6._12_4_;
      local_e40._4_4_ = local_aa0._4_4_ + 1.0;
      local_e40._0_4_ = (float)local_aa0 + 1.0;
      uStack_e38._0_4_ = (float)uStack_a98 + 1.0;
      uStack_e38._4_4_ = uStack_a98._4_4_ + 1.0;
      uStack_e30._0_4_ = 0x3f800000;
      uStack_e30._4_4_ = 0x3f800000;
      uStack_e28._0_4_ = 0x3f800000;
      uStack_e28._4_4_ = 0x3f800000;
      local_a80._0_4_ = local_dc0._0_4_;
      local_a80._4_4_ = local_dc0._4_4_;
      uStack_a78._0_4_ = local_dc0._8_4_;
      uStack_a78._4_4_ = local_dc0._12_4_;
      uStack_a70._0_4_ = local_dc0._16_4_;
      uStack_a70._4_4_ = local_dc0._20_4_;
      uStack_a68._0_4_ = local_dc0._24_4_;
      uStack_a68._4_4_ = local_dc0._28_4_;
      local_de0 = CONCAT44((int)local_a80._4_4_,(int)(float)local_a80);
      uStack_dd8 = CONCAT44((int)uStack_a78._4_4_,(int)(float)uStack_a78);
      uStack_dd0 = CONCAT44((int)uStack_a70._4_4_,(int)(float)uStack_a70);
      uStack_dc8 = CONCAT44((int)uStack_a68._4_4_,(int)(float)uStack_a68);
      local_980 = local_de0;
      uStack_978 = uStack_dd8;
      uStack_970 = uStack_dd0;
      uStack_968 = uStack_dc8;
      local_9a0 = 0x7f0000007f;
      uStack_998 = 0x7f0000007f;
      uStack_990 = 0x7f0000007f;
      uStack_988 = 0x7f0000007f;
      local_a20 = local_de0;
      uStack_a18 = uStack_dd8;
      uStack_a10 = uStack_dd0;
      uStack_a08 = uStack_dc8;
      local_a40 = 0x7f0000007f;
      uStack_a38 = 0x7f0000007f;
      uStack_a30 = 0x7f0000007f;
      uStack_a28 = 0x7f0000007f;
      local_9d0 = 0x7f0000007f;
      uStack_9c8 = 0x7f0000007f;
      local_9e0 = 0x7f0000007f;
      uStack_9d8 = 0x7f0000007f;
      local_510 = local_de0;
      uStack_508 = uStack_dd8;
      local_520 = 0x7f0000007f;
      uStack_518 = 0x7f0000007f;
      auVar21._8_8_ = uStack_dd8;
      auVar21._0_8_ = local_de0;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_9b0 = vpaddd_avx(auVar21,auVar2);
      local_530 = uStack_dd0;
      uStack_528 = uStack_dc8;
      local_540 = 0x7f0000007f;
      uStack_538 = 0x7f0000007f;
      auVar1._8_8_ = uStack_dc8;
      auVar1._0_8_ = uStack_dd0;
      auVar6._8_8_ = 0x7f0000007f;
      auVar6._0_8_ = 0x7f0000007f;
      local_9c0 = vpaddd_avx(auVar1,auVar6);
      local_a60 = local_9b0._0_8_;
      uStack_a58 = local_9b0._8_8_;
      uStack_a50 = local_9c0._0_8_;
      uStack_a48 = local_9c0._8_8_;
      local_a00 = local_9b0._0_8_;
      uStack_9f8 = local_9b0._8_8_;
      uStack_9f0 = local_9c0._0_8_;
      uStack_9e8 = local_9c0._8_8_;
      local_8c0 = local_9b0._0_8_;
      uStack_8b8 = local_9b0._8_8_;
      uStack_8b0 = local_9c0._0_8_;
      uStack_8a8 = local_9c0._8_8_;
      local_8c4 = 0x17;
      local_940 = local_9b0._0_8_;
      uStack_938 = local_9b0._8_8_;
      uStack_930 = local_9c0._0_8_;
      uStack_928 = local_9c0._8_8_;
      local_4d0 = local_9b0._0_8_;
      uStack_4c8 = local_9b0._8_8_;
      local_4d4 = 0x17;
      local_8e0 = vpslld_avx(local_9b0,ZEXT416(0x17));
      local_4f0 = local_9c0._0_8_;
      uStack_4e8 = local_9c0._8_8_;
      local_4f4 = 0x17;
      local_8f0 = vpslld_avx(local_9c0,ZEXT416(0x17));
      local_960 = local_8e0._0_8_;
      uStack_958 = local_8e0._8_8_;
      uStack_950 = local_8f0._0_8_;
      uStack_948 = local_8f0._8_8_;
      local_920 = local_8e0._0_8_;
      uStack_918 = local_8e0._8_8_;
      uStack_910 = local_8f0._0_8_;
      uStack_908 = local_8f0._8_8_;
      local_de0 = local_8e0._0_8_;
      uStack_dd8 = local_8e0._8_8_;
      uStack_dd0 = local_8f0._0_8_;
      uStack_dc8 = local_8f0._8_8_;
      local_d60 = local_8e0._0_8_;
      uStack_d58 = local_8e0._8_8_;
      uStack_d50 = local_8f0._0_8_;
      uStack_d48 = local_8f0._8_8_;
      local_e60 = local_8e0._0_8_;
      uStack_e58 = local_8e0._8_8_;
      uStack_e50 = local_8f0._0_8_;
      uStack_e48 = local_8f0._8_8_;
      local_c80 = _local_e40;
      local_ca0._0_4_ = local_8e0._0_4_;
      local_ca0._4_4_ = local_8e0._4_4_;
      uStack_c98._0_4_ = local_8e0._8_4_;
      uStack_c98._4_4_ = local_8e0._12_4_;
      uStack_c90._0_4_ = local_8f0._0_4_;
      uStack_c90._4_4_ = local_8f0._4_4_;
      uStack_c88._0_4_ = local_8f0._8_4_;
      local_e40._4_4_ = (local_aa0._4_4_ + 1.0) * local_ca0._4_4_;
      local_e40._0_4_ = ((float)local_aa0 + 1.0) * (float)local_ca0;
      uStack_e38._0_4_ = ((float)uStack_a98 + 1.0) * (float)uStack_c98;
      uStack_e38._4_4_ = (uStack_a98._4_4_ + 1.0) * uStack_c98._4_4_;
      uStack_e30._0_4_ = (float)uStack_c90 * 1.0;
      uStack_e30._4_4_ = uStack_c90._4_4_ * 1.0;
      auVar36 = _local_e40;
      uStack_e28._0_4_ = (float)uStack_c88 * 1.0;
      uStack_e28._4_4_ = 0x3f800000;
      auVar3 = _local_e40;
      local_1040 = local_e40;
      uStack_1038 = uStack_e38;
      uStack_e30 = auVar36._16_8_;
      uStack_1030 = uStack_e30;
      uStack_e28 = auVar3._24_8_;
      uStack_1028 = uStack_e28;
      local_f30 = local_fd0;
      local_f60 = local_e40;
      uStack_f58 = uStack_e38;
      uStack_f50 = uStack_e30;
      uStack_f48 = uStack_e28;
      auVar4._16_8_ = uStack_e30;
      auVar4._0_16_ = _local_e40;
      auVar4._24_8_ = uStack_e28;
      *local_fd0 = auVar4;
      local_fd0 = local_fd0 + 1;
      _local_e40 = auVar3;
      _local_da0 = auVar5;
      local_d80 = auVar37;
      local_ca0 = local_8e0._0_8_;
      uStack_c98 = local_8e0._8_8_;
      uStack_c90 = local_8f0._0_8_;
      uStack_c88 = local_8f0._8_8_;
      local_c40 = local_c60;
      uStack_c38 = uStack_c58;
      uStack_c30 = uStack_c50;
      uStack_c28 = uStack_c48;
      local_b78 = local_b98;
      local_b70 = local_b88;
      local_b60 = local_b98;
      local_b58 = local_b88;
      local_b48 = local_b98;
      local_b40 = local_b88;
      local_b30 = local_b98;
      local_b28 = local_b88;
      local_b18 = local_b98;
      local_b10 = local_b88;
      local_af8 = local_b98;
      local_af0 = local_b98;
      local_ad8 = local_b98;
      local_ac8 = local_ae0;
      local_aa0 = uVar7;
      uStack_a98 = uVar8;
      local_a80 = local_dc0._0_8_;
      uStack_a78 = local_dc0._8_8_;
      uStack_a70 = local_dc0._16_8_;
      uStack_a68 = local_dc0._24_8_;
    }
    for (; local_eb8 = local_f70, local_ff8 = local_f08, local_101c + 3 < local_fc4;
        local_101c = local_101c + 4) {
      local_f28 = local_fd0;
      local_330 = *(undefined8 *)*local_fd0;
      uStack_328 = *(undefined8 *)(*local_fd0 + 8);
      local_e78 = local_fa9;
      local_e80 = &local_1050;
      local_3f0 = ZEXT816(0) << 0x20;
      local_490 = 0x3f8000003f800000;
      uStack_488 = 0x3f8000003f800000;
      local_340 = 0x42b0c0a542b0c0a5;
      uStack_338 = 0x42b0c0a542b0c0a5;
      auVar25._8_8_ = 0x42b0c0a542b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(*(undefined1 (*) [16])*local_fd0,auVar25);
      local_450._0_8_ = auVar6._0_8_;
      local_310 = local_450._0_8_;
      local_450._8_8_ = auVar6._8_8_;
      uStack_308 = local_450._8_8_;
      local_320 = 0xc2b0c0a5c2b0c0a5;
      uStack_318 = 0xc2b0c0a5c2b0c0a5;
      auVar26._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar6,auVar26);
      local_450._0_8_ = auVar2._0_8_;
      uVar7 = local_450._0_8_;
      local_450._8_8_ = auVar2._8_8_;
      uVar8 = local_450._8_8_;
      local_3a0 = 0x3fb8aa3b3fb8aa3b;
      uStack_398 = 0x3fb8aa3b3fb8aa3b;
      local_390._0_4_ = auVar2._0_4_;
      local_390._4_4_ = auVar2._4_4_;
      uStack_388._0_4_ = auVar2._8_4_;
      uStack_388._4_4_ = auVar2._12_4_;
      local_470._4_4_ = local_390._4_4_ * 1.442695;
      local_470._0_4_ = (float)local_390 * 1.442695;
      uStack_468._0_4_ = (float)uStack_388 * 1.442695;
      uStack_468._4_4_ = uStack_388._4_4_ * 1.442695;
      local_2d0 = local_470;
      uStack_2c8 = uStack_468;
      local_2e0 = 0x3f0000003f000000;
      uStack_2d8 = 0x3f0000003f000000;
      local_470._0_4_ = (float)local_390 * 1.442695 + 0.5;
      local_470._4_4_ = local_390._4_4_ * 1.442695 + 0.5;
      fVar38 = (float)uStack_388 * 1.442695 + 0.5;
      fVar39 = uStack_388._4_4_ * 1.442695 + 0.5;
      uStack_468._0_4_ = fVar38;
      uStack_468._4_4_ = fVar39;
      local_2b0 = local_470;
      uStack_2a8 = uStack_468;
      local_480._4_4_ = (int)(float)local_470._4_4_;
      local_480._0_4_ = (int)(float)local_470._0_4_;
      local_480._8_4_ = (int)fVar38;
      local_480._12_4_ = (int)fVar39;
      local_2a0 = local_480._0_8_;
      uStack_298 = local_480._8_8_;
      auVar27._8_8_ = local_480._8_8_;
      auVar27._0_8_ = local_480._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar27);
      local_460 = auVar1._0_8_;
      local_280 = local_460;
      uStack_458 = auVar1._8_8_;
      uStack_278 = uStack_458;
      local_290 = local_470;
      uStack_288 = uStack_468;
      auVar28._8_8_ = uStack_468;
      auVar28._0_8_ = local_470;
      auVar6 = vcmpps_avx(auVar28,auVar1,1);
      local_4a0._0_8_ = auVar6._0_8_;
      local_420 = local_4a0._0_8_;
      local_4a0._8_8_ = auVar6._8_8_;
      uStack_418 = local_4a0._8_8_;
      local_430 = 0x3f8000003f800000;
      uStack_428 = 0x3f8000003f800000;
      auVar22._8_8_ = 0x3f8000003f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      local_4a0 = vpand_avx(auVar6,auVar22);
      local_400 = local_460;
      uStack_3f8 = uStack_458;
      local_410 = local_4a0._0_8_;
      uStack_408 = local_4a0._8_8_;
      _local_470 = vsubps_avx(auVar1,local_4a0);
      local_260 = local_470;
      local_250 = ::_ps_cephes_exp_C1;
      local_270 = local_450;
      local_190 = local_470;
      uStack_188 = uStack_468;
      local_1a0[0] = 0.6933594;
      local_1a0[1] = 0.6933594;
      afStack_198[0] = 0.6933594;
      afStack_198[1] = 0.6933594;
      local_1b0 = local_450._0_8_;
      uStack_1a8 = local_450._8_8_;
      auVar29._8_4_ = 0.6933594;
      auVar29._12_4_ = 0.6933594;
      auVar29._0_4_ = 0.6933594;
      auVar29._4_4_ = 0.6933594;
      auVar6 = vfnmadd213ps_fma(auVar29,_local_470,auVar2);
      local_268 = ::_ps_cephes_exp_C2;
      local_160 = local_470;
      uStack_158 = uStack_468;
      local_170[0] = -0.00021219444;
      local_170[1] = -0.00021219444;
      afStack_168[0] = -0.00021219444;
      afStack_168[1] = -0.00021219444;
      local_450._0_8_ = auVar6._0_8_;
      local_180 = local_450._0_8_;
      local_450._8_8_ = auVar6._8_8_;
      uStack_178 = local_450._8_8_;
      auVar30._8_4_ = -0.00021219444;
      auVar30._12_4_ = -0.00021219444;
      auVar30._0_4_ = -0.00021219444;
      auVar30._4_4_ = -0.00021219444;
      local_450 = vfnmadd213ps_fma(auVar30,_local_470,auVar6);
      local_3c0 = local_450._0_8_;
      uStack_3b8 = local_450._8_8_;
      local_3b0._0_4_ = local_450._0_4_;
      local_3b0._4_4_ = local_450._4_4_;
      uStack_3a8._0_4_ = local_450._8_4_;
      uStack_3a8._4_4_ = local_450._12_4_;
      local_460._4_4_ = local_3b0._4_4_ * local_3b0._4_4_;
      local_460._0_4_ = (float)local_3b0 * (float)local_3b0;
      uStack_458._0_4_ = (float)uStack_3a8 * (float)uStack_3a8;
      uStack_458._4_4_ = uStack_3a8._4_4_ * uStack_3a8._4_4_;
      uStack_4a8 = 0x3950696739506967;
      local_4b0 = (undefined1  [8])0x3950696739506967;
      local_230 = local_4b0;
      local_1c8 = ::_ps_cephes_exp_p1;
      local_130 = 0x3950696739506967;
      uStack_128 = 0x3950696739506967;
      local_140 = local_450._0_8_;
      uStack_138 = local_450._8_8_;
      local_150[0] = 0.0013981999;
      local_150[1] = 0.0013981999;
      afStack_148[0] = 0.0013981999;
      afStack_148[1] = 0.0013981999;
      auVar31._8_4_ = 0.0013981999;
      auVar31._12_4_ = 0.0013981999;
      auVar31._0_4_ = 0.0013981999;
      auVar31._4_4_ = 0.0013981999;
      auVar6 = vfmadd213ps_fma(local_450,_local_4b0,auVar31);
      local_1e0 = ::_ps_cephes_exp_p2;
      local_4b0 = auVar6._0_8_;
      local_100 = local_4b0;
      uStack_4a8 = auVar6._8_8_;
      uStack_f8 = uStack_4a8;
      local_110 = local_450._0_8_;
      uStack_108 = local_450._8_8_;
      local_120[0] = 0.008333452;
      local_120[1] = 0.008333452;
      afStack_118[0] = 0.008333452;
      afStack_118[1] = 0.008333452;
      auVar32._8_4_ = 0.008333452;
      auVar32._12_4_ = 0.008333452;
      auVar32._0_4_ = 0.008333452;
      auVar32._4_4_ = 0.008333452;
      auVar6 = vfmadd213ps_fma(local_450,auVar6,auVar32);
      local_1f8 = ::_ps_cephes_exp_p3;
      local_4b0 = auVar6._0_8_;
      local_d0 = local_4b0;
      uStack_4a8 = auVar6._8_8_;
      uStack_c8 = uStack_4a8;
      local_e0 = local_450._0_8_;
      uStack_d8 = local_450._8_8_;
      local_f0[0] = 0.041665796;
      local_f0[1] = 0.041665796;
      afStack_e8[0] = 0.041665796;
      afStack_e8[1] = 0.041665796;
      auVar33._8_4_ = 0.041665796;
      auVar33._12_4_ = 0.041665796;
      auVar33._0_4_ = 0.041665796;
      auVar33._4_4_ = 0.041665796;
      auVar6 = vfmadd213ps_fma(local_450,auVar6,auVar33);
      local_210 = ::_ps_cephes_exp_p4;
      local_4b0 = auVar6._0_8_;
      local_a0 = local_4b0;
      uStack_4a8 = auVar6._8_8_;
      uStack_98 = uStack_4a8;
      local_b0 = local_450._0_8_;
      uStack_a8 = local_450._8_8_;
      local_c0[0] = 0.16666666;
      local_c0[1] = 0.16666666;
      afStack_b8[0] = 0.16666666;
      afStack_b8[1] = 0.16666666;
      auVar34._8_4_ = 0.16666666;
      auVar34._12_4_ = 0.16666666;
      auVar34._0_4_ = 0.16666666;
      auVar34._4_4_ = 0.16666666;
      auVar6 = vfmadd213ps_fma(local_450,auVar6,auVar34);
      local_228 = ::_ps_cephes_exp_p5;
      local_4b0 = auVar6._0_8_;
      local_70 = local_4b0;
      uStack_4a8 = auVar6._8_8_;
      uStack_68 = uStack_4a8;
      local_80 = local_450._0_8_;
      uStack_78 = local_450._8_8_;
      local_90[0] = 0.5;
      local_90[1] = 0.5;
      afStack_88[0] = 0.5;
      afStack_88[1] = 0.5;
      auVar35._8_4_ = 0.5;
      auVar35._12_4_ = 0.5;
      auVar35._0_4_ = 0.5;
      auVar35._4_4_ = 0.5;
      auVar6 = vfmadd213ps_fma(local_450,auVar6,auVar35);
      local_238 = local_460;
      local_4b0 = auVar6._0_8_;
      local_40 = local_4b0;
      uStack_4a8 = auVar6._8_8_;
      uStack_38 = uStack_4a8;
      local_50 = local_460;
      uStack_48 = uStack_458;
      local_60 = local_450._0_8_;
      uStack_58 = local_450._8_8_;
      auVar6 = vfmadd213ps_fma(_local_460,auVar6,local_450);
      local_4b0 = auVar6._0_8_;
      uVar9 = local_4b0;
      uStack_4a8 = auVar6._8_8_;
      uVar10 = uStack_4a8;
      local_300 = 0x3f8000003f800000;
      uStack_2f8 = 0x3f8000003f800000;
      local_2f0._0_4_ = auVar6._0_4_;
      local_2f0._4_4_ = auVar6._4_4_;
      uStack_2e8._0_4_ = auVar6._8_4_;
      uStack_2e8._4_4_ = auVar6._12_4_;
      local_4b0._4_4_ = local_2f0._4_4_ + 1.0;
      local_4b0._0_4_ = (float)local_2f0 + 1.0;
      uStack_4a8._0_4_ = (float)uStack_2e8 + 1.0;
      uStack_4a8._4_4_ = uStack_2e8._4_4_ + 1.0;
      local_2c0._0_4_ = local_470._0_4_;
      local_2c0._4_4_ = local_470._4_4_;
      uStack_2b8._0_4_ = local_470._8_4_;
      uStack_2b8._4_4_ = local_470._12_4_;
      local_480._4_4_ = (int)local_2c0._4_4_;
      local_480._0_4_ = (int)(float)local_2c0;
      local_480._8_4_ = (int)(float)uStack_2b8;
      local_480._12_4_ = (int)uStack_2b8._4_4_;
      local_370 = local_480._0_8_;
      uStack_368 = local_480._8_8_;
      local_380 = 0x7f0000007f;
      uStack_378 = 0x7f0000007f;
      auVar24._8_8_ = local_480._8_8_;
      auVar24._0_8_ = local_480._0_8_;
      auVar23._8_8_ = 0x7f0000007f;
      auVar23._0_8_ = 0x7f0000007f;
      auVar6 = vpaddd_avx(auVar24,auVar23);
      local_480._0_8_ = auVar6._0_8_;
      local_350 = local_480._0_8_;
      local_480._8_8_ = auVar6._8_8_;
      uStack_348 = local_480._8_8_;
      local_354 = 0x17;
      local_480 = vpslld_avx(auVar6,ZEXT416(0x17));
      local_440 = local_480._0_8_;
      uStack_438 = local_480._8_8_;
      local_4c0 = local_480._0_8_;
      uStack_4b8 = local_480._8_8_;
      local_3d0 = _local_4b0;
      local_3e0._0_4_ = local_480._0_4_;
      local_3e0._4_4_ = local_480._4_4_;
      uStack_3d8._0_4_ = local_480._8_4_;
      uStack_3d8._4_4_ = local_480._12_4_;
      local_4b0._4_4_ = (local_2f0._4_4_ + 1.0) * local_3e0._4_4_;
      local_4b0._0_4_ = ((float)local_2f0 + 1.0) * (float)local_3e0;
      uStack_4a8._0_4_ = ((float)uStack_2e8 + 1.0) * (float)uStack_3d8;
      uStack_4a8._4_4_ = (uStack_2e8._4_4_ + 1.0) * uStack_3d8._4_4_;
      local_1050 = local_4b0;
      uStack_1048 = uStack_4a8;
      local_f10 = local_fd0;
      local_f20 = local_4b0;
      uStack_f18 = uStack_4a8;
      auVar11._8_8_ = uStack_4a8;
      auVar11._0_8_ = local_4b0;
      *(undefined1 (*) [16])*local_fd0 = auVar11;
      local_fd0 = (undefined1 (*) [32])(*local_fd0 + 0x10);
      local_3e0 = local_480._0_8_;
      uStack_3d8 = local_480._8_8_;
      local_3b0 = local_3c0;
      uStack_3a8 = uStack_3b8;
      local_390 = uVar7;
      uStack_388 = uVar8;
      local_2f0 = uVar9;
      uStack_2e8 = uVar10;
      local_2c0 = local_470;
      uStack_2b8 = uStack_468;
      local_258 = local_270;
      local_248 = local_260;
      local_240 = local_270;
      local_220 = local_270;
      local_218 = local_230;
      local_208 = local_270;
      local_200 = local_230;
      local_1f0 = local_270;
      local_1e8 = local_230;
      local_1d8 = local_270;
      local_1d0 = local_230;
      local_1c0 = local_270;
      local_1b8 = local_230;
    }
    for (; local_101c < local_fc4; local_101c = local_101c + 1) {
      local_e68 = local_fa9;
      local_e70 = local_fd0;
      fVar38 = expf(*(float *)*local_fd0);
      *(float *)*local_fd0 = fVar38;
      local_fd0 = (undefined1 (*) [32])(*local_fd0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}